

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O2

void __thiscall TokenizerException::~TokenizerException(TokenizerException *this)

{
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  operator_delete(this,0x10);
  return;
}

Assistant:

TokenizerException(const string &message, int line_number, int col_number, const string &line) :
            runtime_error("") {
        stringstream ss;
        cout << line << endl;
        ss << message << '\n'
           << line << '\n'
           << string(col_number, ' ') << "^~~~" << '\n'
           << "  at line " << line_number << " col " << col_number;
        static_cast<std::runtime_error &>(*this) = std::runtime_error(ss.str());
    }